

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

SOURCE_HANDLE source_create(void)

{
  AMQP_VALUE pAVar1;
  SOURCE_HANDLE local_10;
  SOURCE_INSTANCE *source_instance;
  
  local_10 = (SOURCE_HANDLE)malloc(8);
  if (local_10 != (SOURCE_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x28);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (SOURCE_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

SOURCE_HANDLE source_create(void)
{
    SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)malloc(sizeof(SOURCE_INSTANCE));
    if (source_instance != NULL)
    {
        source_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(40);
        if (source_instance->composite_value == NULL)
        {
            free(source_instance);
            source_instance = NULL;
        }
    }

    return source_instance;
}